

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void delds(int D,int s,double *C)

{
  double *B;
  double *A;
  double *oup;
  double *vec;
  int j;
  int i;
  double *C_local;
  int s_local;
  int D_local;
  
  B = (double *)malloc((long)(s + 1) << 3);
  A = (double *)malloc((long)(D * s + 1) << 3);
  for (vec._4_4_ = 0; vec._4_4_ < s + 1; vec._4_4_ = vec._4_4_ + 1) {
    B[vec._4_4_] = 0.0;
  }
  *B = 1.0;
  B[s] = -1.0;
  *A = 1.0;
  for (vec._4_4_ = 0; vec._4_4_ < D; vec._4_4_ = vec._4_4_ + 1) {
    poly(A,B,C,vec._4_4_ * s + 1,s + 1);
    for (vec._0_4_ = 0; (int)vec < s * (vec._4_4_ + 1) + 1; vec._0_4_ = (int)vec + 1) {
      A[(int)vec] = C[(int)vec];
    }
  }
  free(B);
  free(A);
  return;
}

Assistant:

void delds(int D, int s, double *C) {
	int i,j;
	double *vec,*oup;
	/*
	 * delds returns coefficients of [1,....(s-1) zeroes,.. -1]^D
	 * eg., D =1 s = 4 yields
	 * [1,0,0,0,-1]
	 * D=2 s=4 -> [1,0,0,0,-2,0,0,0,1]
	 */ 
	/*
	 * s - seasonal component
	 * s = 4 (quarterly data), 12 (yearly data) etc.
	 * D - Differencing operator. D >= 1 when seasonal component is present
	 * D is usually 1 when seasonal component is present. D = 0 means no
	 * seasonal component
	 */ 
	vec = (double*) malloc(sizeof(double) * (s+1));
	oup = (double*) malloc(sizeof(double) * (D*s + 1));
	for(i = 0; i < s+1; ++i) {
		vec[i] = 0.;
	}
	vec[0] = 1.0;
	vec[s] = -1.0;
	oup[0] = 1.0;
	
	for(i = 0; i < D; ++i) {
		poly(oup,vec,C,i*s+1,s+1);
		for(j = 0; j < s*(i+1)+1; ++j) {
			oup[j] = C[j];
		}
		
	}
	free(vec);
	free(oup);
}